

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O0

int arkInterpSetDegree_Hermite(void *arkode_mem,ARKInterp interp,int degree)

{
  int iVar1;
  int in_EDX;
  undefined8 *in_RSI;
  ARKodeMem in_RDI;
  ARKodeMem ark_mem;
  int local_2c;
  int local_1c;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    local_4 = -0x15;
  }
  else {
    iVar1 = in_EDX;
    if (in_EDX < 1) {
      iVar1 = -in_EDX;
    }
    if (iVar1 == *(int *)*in_RSI) {
      local_4 = 0;
    }
    else if (in_EDX < 0) {
      local_1c = -in_EDX;
      if (5 < local_1c) {
        local_1c = 5;
      }
      if (*(int *)*in_RSI < local_1c) {
        local_2c = *(int *)*in_RSI;
      }
      else {
        local_2c = local_1c;
      }
      *(int *)*in_RSI = local_2c;
      local_4 = 0;
    }
    else if (in_EDX < 6) {
      *(int *)*in_RSI = in_EDX;
      local_4 = 0;
    }
    else {
      arkProcessError(in_RDI,-0x28,"ARKode","arkInterpSetDegree_Hermite","Illegal degree specified."
                     );
      local_4 = -0x16;
    }
  }
  return local_4;
}

Assistant:

int arkInterpSetDegree_Hermite(void* arkode_mem, ARKInterp interp,
                               int degree)
{
  ARKodeMem ark_mem;

  /* access ARKodeMem structure */
  if (arkode_mem == NULL)  return(ARK_MEM_NULL);
  ark_mem = (ARKodeMem) arkode_mem;

  /* if this degree is already stored, just return */
  if (abs(degree) == HINT_DEGREE(interp))  return(ARK_SUCCESS);

  /* on positive degree, check for allowable value and overwrite stored degree */
  if (degree >= 0) {
    if (degree > ARK_INTERP_MAX_DEGREE) {
      arkProcessError(ark_mem, ARK_INTERP_FAIL, "ARKode",
                      "arkInterpSetDegree_Hermite",
                      "Illegal degree specified.");
      return(ARK_ILL_INPUT);
    }

    HINT_DEGREE(interp) = degree;
    return(ARK_SUCCESS);
  }

  /* on negative degree, check for allowable value and update stored degree */
  degree = -degree;
  if (degree > ARK_INTERP_MAX_DEGREE) degree = ARK_INTERP_MAX_DEGREE;
  HINT_DEGREE(interp) = SUNMIN(HINT_DEGREE(interp), degree);

  return(ARK_SUCCESS);
}